

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::UninterpretedOption::Swap(UninterpretedOption *this,UninterpretedOption *other)

{
  UninterpretedOption *other_local;
  UninterpretedOption *this_local;
  
  if (other != this) {
    RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>::Swap
              (&this->name_,&other->name_);
    std::swap<std::__cxx11::string*>(&this->identifier_value_,&other->identifier_value_);
    std::swap<unsigned_long>(&this->positive_int_value_,&other->positive_int_value_);
    std::swap<long>(&this->negative_int_value_,&other->negative_int_value_);
    std::swap<double>(&this->double_value_,&other->double_value_);
    std::swap<std::__cxx11::string*>(&this->string_value_,&other->string_value_);
    std::swap<std::__cxx11::string*>(&this->aggregate_value_,&other->aggregate_value_);
    std::swap<unsigned_int>(this->_has_bits_,other->_has_bits_);
    UnknownFieldSet::Swap(&this->_unknown_fields_,&other->_unknown_fields_);
    std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  }
  return;
}

Assistant:

void UninterpretedOption::Swap(UninterpretedOption* other) {
  if (other != this) {
    name_.Swap(&other->name_);
    std::swap(identifier_value_, other->identifier_value_);
    std::swap(positive_int_value_, other->positive_int_value_);
    std::swap(negative_int_value_, other->negative_int_value_);
    std::swap(double_value_, other->double_value_);
    std::swap(string_value_, other->string_value_);
    std::swap(aggregate_value_, other->aggregate_value_);
    std::swap(_has_bits_[0], other->_has_bits_[0]);
    _unknown_fields_.Swap(&other->_unknown_fields_);
    std::swap(_cached_size_, other->_cached_size_);
  }
}